

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepvalue(rnndb *db,rnnvalue *val,char *prefix,rnnvarinfo *parvi)

{
  char *pcVar1;
  char *pcVar2;
  char *tmp;
  rnnvarinfo *parvi_local;
  char *prefix_local;
  rnnvalue *val_local;
  rnndb *db_local;
  
  pcVar1 = catstr(prefix,val->name);
  val->fullname = pcVar1;
  prepvarinfo(db,val->fullname,&val->varinfo,parvi);
  if (((val->varinfo).dead == 0) && ((val->varinfo).prefix != (char *)0x0)) {
    pcVar1 = val->fullname;
    pcVar2 = catstr((val->varinfo).prefix,val->fullname);
    val->fullname = pcVar2;
    free(pcVar1);
  }
  return;
}

Assistant:

static void prepvalue(struct rnndb *db, struct rnnvalue *val, char *prefix, struct rnnvarinfo *parvi) {
	val->fullname = catstr(prefix, val->name);
	prepvarinfo (db, val->fullname, &val->varinfo, parvi);
	if (val->varinfo.dead)
		return;
	if (val->varinfo.prefix) {
		char *tmp = val->fullname;
		val->fullname = catstr(val->varinfo.prefix, val->fullname);
		free(tmp);
	}
}